

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

bool __thiscall
NumberTemp::IsTempIndirTransferLoad(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  Opnd *this_00;
  long lVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  Opnd *src1Opnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  bVar3 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if (!bVar3) {
    return false;
  }
  if ((this->nonTempElemLoad & 1U) != 0) {
    return false;
  }
  this_00 = instr->m_src1;
  if (instr->m_opcode == LdElemI_A) {
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) {
LAB_00630d4a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    lVar1 = *(long *)&this_00[1].m_valueType;
    if (lVar1 != 0) {
      if ((*(byte *)(*(long *)(lVar1 + 0x10) + 0x18) & 2) == 0) {
        local_1a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(lVar1 + 8);
        bVar3 = ValueType::IsInt((ValueType *)&local_1a.field_0);
        if (bVar3) {
          return false;
        }
      }
      return (bool)((this_00->field_0xb & 0x10) >> 4);
    }
  }
  else if (((this_00 != (Opnd *)0x0) && (OVar4 = IR::Opnd::GetKind(this_00), OVar4 != OpndKindSym))
          && ((instr->m_src1->field_0xb & 0x10) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x2fd,
                       "(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp())"
                       ,
                       "instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp()"
                      );
    if (!bVar3) goto LAB_00630d4a;
    *puVar5 = 0;
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempIndirTransferLoad(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        if (instr->m_opcode == Js::OpCode::LdElemI_A)
        {
            // If the index is an int, then we don't care about the non-temp use
            IR::Opnd * src1Opnd = instr->GetSrc1();
            IR::RegOpnd * indexOpnd = src1Opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd && (indexOpnd->m_sym->m_isNotNumber || !indexOpnd->GetValueType().IsInt()))
            {
                return src1Opnd->CanStoreTemp();
            }
        }
        else
        {
            // All other opcode shouldn't have sym opnd that can store temp, See ObjectTemp::IsTempUseOpCodeSym.
            Assert(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd()
                || !instr->GetSrc1()->CanStoreTemp());
        }
    }
    return false;
}